

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:276:28),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:278:10)>
::getImpl(TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:276:28),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:278:10)>
          *this,ExceptionOrValue *output)

{
  undefined8 *puVar1;
  long *plVar2;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> depResult;
  DebugComparison<kj::Exception::Type,_kj::Exception::Type> local_3b8;
  ExceptionOrValue local_398;
  char local_200;
  undefined8 *local_1c8;
  long *local_1c0;
  ExceptionOr<kj::_::Void> local_1b8;
  
  local_398.exception.ptr.isSet = false;
  local_200 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_398);
  plVar2 = local_1c0;
  puVar1 = local_1c8;
  if (local_398.exception.ptr.isSet == true) {
    local_3b8.left = local_398.exception.ptr.field_1.value.type;
    local_3b8.right = DISCONNECTED;
    local_3b8.op.content.ptr = " == ";
    local_3b8.op.content.size_ = 5;
    local_3b8.result = local_398.exception.ptr.field_1.value.type == DISCONNECTED;
    if ((!local_3b8.result) && (Debug::minSeverity < 3)) {
      Debug::log<char_const(&)[66],kj::_::DebugComparison<kj::Exception::Type,kj::Exception::Type>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x117,ERROR,
                 "\"failed: expected \" \"e.getType() == kj::Exception::Type::DISCONNECTED\", _kjCondition"
                 ,(char (*) [66])"failed: expected e.getType() == kj::Exception::Type::DISCONNECTED"
                 ,&local_3b8);
    }
    local_1b8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1b8.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_1b8);
  }
  else {
    if (local_200 != '\x01') goto LAB_002391f8;
    local_1c0 = (long *)0x0;
    if (Debug::minSeverity < 3) {
      Debug::log<char_const(&)[19]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x115,ERROR,"\"should have thrown\"",(char (*) [19])0x4d9670);
    }
    if (plVar2 != (long *)0x0) {
      (**(code **)*puVar1)(puVar1,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    local_1b8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1b8.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_1b8);
  }
  if (local_1b8.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1b8.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_002391f8:
  plVar2 = local_1c0;
  if ((local_200 == '\x01') && (local_1c0 != (long *)0x0)) {
    local_1c0 = (long *)0x0;
    (**(code **)*local_1c8)(local_1c8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  if (local_398.exception.ptr.isSet == true) {
    Exception::~Exception(&local_398.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }